

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

uint32_t cache_numbits(io_buf *buf,int filepointer)

{
  undefined4 extraout_EAX;
  uint uVar1;
  int extraout_var;
  undefined4 extraout_var_00;
  vw_exception *pvVar2;
  undefined4 in_register_00000034;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  char temp;
  size_t v_length;
  vector<char,_std::allocator<char>_> t;
  version_struct v_tmp;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  uint32_t cache_numbits;
  ostream local_1a0;
  
  (*buf->_vptr_io_buf[5])(buf,CONCAT44(in_register_00000034,filepointer),&v_length,8);
  if (0x3d < v_length) {
    std::__cxx11::stringstream::stringstream((stringstream *)&cache_numbits);
    std::operator<<(&local_1a0,"cache version too long, cache file is probably invalid");
    pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
               ,0x60,&local_1d0);
    __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (v_length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&cache_numbits);
    std::operator<<(&local_1a0,"cache version too short, cache file is probably invalid");
    pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
               ,99,&local_1f0);
    __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::vector<char,_std::allocator<char>_>::vector(&t,v_length,(allocator_type *)&cache_numbits);
  (*buf->_vptr_io_buf[5])
            (buf,filepointer,
             t.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,v_length);
  version_struct::from_string
            (&v_tmp,t.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  iVar4 = -(uint)(v_tmp.major == version.major);
  iVar5 = -(uint)(v_tmp.minor == version.minor);
  auVar3._4_4_ = iVar4;
  auVar3._0_4_ = iVar4;
  auVar3._8_4_ = iVar5;
  auVar3._12_4_ = iVar5;
  uVar1 = movmskpd(extraout_EAX,auVar3);
  if ((((uVar1 & 1) == 0) || ((byte)((byte)uVar1 >> 1) == 0)) || (v_tmp.rev != version.rev)) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&t.super__Vector_base<char,_std::allocator<char>_>);
    cache_numbits = 0;
  }
  else {
    iVar4 = (*buf->_vptr_io_buf[5])(buf,filepointer,&temp,1);
    if (CONCAT44(extraout_var,iVar4) == 0 || extraout_var < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&cache_numbits);
      std::operator<<(&local_1a0,"failed to read");
      pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x70,&local_210);
      __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (temp != 'c') {
      std::__cxx11::stringstream::stringstream((stringstream *)&cache_numbits);
      std::operator<<(&local_1a0,"data file is not a cache file");
      pvVar2 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x73,&local_230);
      __cxa_throw(pvVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&t.super__Vector_base<char,_std::allocator<char>_>);
    iVar4 = (*buf->_vptr_io_buf[5])(buf,filepointer,&cache_numbits,4);
    if (CONCAT44(extraout_var_00,iVar4) < 4) {
      cache_numbits = 1;
    }
  }
  return cache_numbits;
}

Assistant:

uint32_t cache_numbits(io_buf* buf, int filepointer)
{
  try
  {
    size_t v_length;
    buf->read_file(filepointer, (char*)&v_length, sizeof(v_length));
    if (v_length > 61)
      THROW("cache version too long, cache file is probably invalid");

    if (v_length == 0)
      THROW("cache version too short, cache file is probably invalid");

    std::vector<char> t(v_length);
    buf->read_file(filepointer, t.data(), v_length);
    version_struct v_tmp(t.data());
    if (v_tmp != version)
    {
      //      cout << "cache has possibly incompatible version, rebuilding" << endl;
      return 0;
    }

    char temp;
    if (buf->read_file(filepointer, &temp, 1) < 1)
      THROW("failed to read");

    if (temp != 'c')
      THROW("data file is not a cache file");
  }
  catch (...)
  {
    // TODO fix this exception bubbling behavior: https://github.com/VowpalWabbit/vowpal_wabbit/issues/1774
    // Prior to using a std::vector, a v_array was used and the catch statement was used to delete it.
    // This caused any exception to be ignored. Bubbling up this exception causes tests to fail so
    // I am going to swallow it to maintain previous behavior.
  }

  uint32_t cache_numbits;
  if (buf->read_file(filepointer, &cache_numbits, sizeof(cache_numbits)) < (int)sizeof(cache_numbits))
  {
    return true;
  }

  return cache_numbits;
}